

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s-hierarchy-decoder-CH.cc
# Opt level: O3

Expression __thiscall
RNNLanguageModel<cnn::FastLSTMBuilder>::BuildTaggingGraph
          (RNNLanguageModel<cnn::FastLSTMBuilder> *this,vector<int,_std::allocator<int>_> *sent,
          vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
          *chars,vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                 *labels,
          vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
          *results,ComputationGraph *cg,double *cor,uint *predict,uint *overall,bool train)

{
  pointer *ppiVar1;
  vector<int,std::allocator<int>> *this_00;
  uint v;
  pointer pvVar2;
  pointer pvVar3;
  iterator __position;
  undefined1 auVar4 [16];
  int *piVar5;
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  *pvVar6;
  RNNBuilder *this_01;
  ExecutionEngine *pEVar7;
  vector<int,_std::allocator<int>_> *pvVar8;
  RNNLanguageModel<cnn::FastLSTMBuilder> *pRVar9;
  pointer pEVar10;
  Tensor *pTVar11;
  ExecutionEngine *pEVar12;
  ulong uVar13;
  long lVar14;
  long lVar15;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 uVar16;
  uint uVar17;
  int iVar18;
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  *pvVar19;
  ulong uVar20;
  long lVar21;
  bool bVar22;
  double dVar23;
  undefined1 auVar24 [64];
  undefined1 extraout_var [56];
  undefined1 auVar25 [64];
  undefined1 extraout_var_00 [56];
  undefined1 extraout_var_01 [56];
  undefined1 extraout_var_02 [56];
  undefined1 extraout_var_03 [56];
  undefined1 auVar26 [16];
  undefined8 in_XMM2_Qb;
  Expression EVar27;
  undefined7 in_stack_00000021;
  char in_stack_00000028;
  Expression oh;
  vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_> alpha_i;
  int bestk;
  Expression i_charpadding1;
  Expression i_charpadding_1;
  Expression i_wordpadding1;
  Expression i_wordpadding_1;
  vector<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>,_std::allocator<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>_>_>
  i_char;
  vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_> i_inputw;
  Expression i_l;
  vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_> i_input;
  vector<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>,_std::allocator<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>_>_>
  i_charw;
  Expression input_cols;
  Expression i_charpadding2;
  Expression i_charpadding_2;
  Expression i_wordpadding2;
  Expression i_wordpadding_2;
  vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_> i_oh;
  vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_> errs;
  Expression i_lh;
  Expression i_lhbias;
  Expression i_oh2lh;
  vector<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>,_std::allocator<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>_>_>
  i_charxExp;
  vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_> i_word;
  vector<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>,_std::allocator<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>_>_>
  i_charPool;
  vector<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>,_std::allocator<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>_>_>
  i_charh;
  vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_> revs;
  vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_> fwds;
  vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_> i_charinput;
  vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_> i_charSum;
  vector<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>,_std::allocator<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>_>_>
  i_charxMExp;
  Expression i_lh2l;
  Expression i_u;
  Expression oh2ohxMExp;
  Expression i_oh2ohxMExp;
  Expression i_xMExpbias;
  Expression i_word2xMExp;
  Expression i_charh2xMExp;
  Expression i_charhbias;
  Expression i_charw2charh;
  Expression i_xMExp2xExp;
  Expression combine_h;
  Expression alpha;
  undefined1 local_428 [8];
  pointer pEStack_420;
  ComputationGraph *local_418;
  uint local_410;
  uint uStack_40c;
  uint local_408;
  undefined4 uStack_404;
  uint local_400;
  ComputationGraph *local_3f8;
  uint local_3f0;
  ComputationGraph *local_3e8;
  uint local_3e0;
  undefined1 local_3d8 [8];
  size_type local_3d0;
  undefined1 local_3c8 [24];
  undefined8 local_3b0;
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  *local_3a8;
  uint local_39c;
  RNNBuilder *local_398;
  undefined1 local_390 [24];
  uint local_378;
  undefined1 local_370 [24];
  uint local_358;
  ExecutionEngine *local_350;
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  *local_348;
  ExecutionEngine *local_340;
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  *local_338;
  vector<int,_std::allocator<int>_> *local_330;
  vector<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>,_std::allocator<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>_>_>
  local_328;
  vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_> local_310;
  initializer_list<cnn::expr::Expression> local_2f8;
  Expression local_2e8;
  vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_> local_2d8;
  vector<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>,_std::allocator<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>_>_>
  local_2c0;
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  *local_2a8;
  initializer_list<cnn::expr::Expression> local_2a0;
  undefined1 local_290 [32];
  undefined1 local_270 [24];
  undefined4 local_258;
  vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_> local_250;
  Expression *local_238;
  Expression *local_230;
  ComputationGraph *local_228;
  ulong local_220;
  undefined1 local_218 [16];
  pointer local_208;
  initializer_list<cnn::expr::Expression> local_200;
  undefined1 local_1f0 [24];
  uint local_1d8;
  vector<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>,_std::allocator<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>_>_>
  local_1d0;
  vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_> local_1b8;
  RNNLanguageModel<cnn::FastLSTMBuilder> *local_1a0;
  vector<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>,_std::allocator<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>_>_>
  local_198;
  vector<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>,_std::allocator<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>_>_>
  local_180;
  vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_> local_168;
  vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_> local_150;
  vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_> local_138;
  vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_> local_120;
  vector<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>,_std::allocator<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>_>_>
  local_108;
  undefined1 local_f0 [16];
  undefined1 local_e0 [16];
  undefined1 local_d0 [16];
  undefined1 local_c0 [24];
  undefined4 local_a8;
  undefined1 local_a0 [24];
  uint local_88;
  undefined1 local_80 [24];
  uint local_68;
  Expression local_60;
  Expression local_50;
  Expression local_40;
  
  pvVar2 = (chars->
           super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  ppiVar1 = &sent[7].super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
             _M_finish;
  pvVar3 = (chars->
           super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  if (((ulong)sent[7].super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
              _M_end_of_storage & 0xfffffffd00000000) == 0) {
    *(undefined4 *)
     ((long)&sent[7].super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
             _M_end_of_storage + 4) = 1;
  }
  local_3b0 = labels;
  local_348 = results;
  local_2a8 = chars;
  local_230 = (Expression *)ppiVar1;
  local_228 = cg;
  (**(code **)(*ppiVar1 + 0x12))(ppiVar1,cor);
  local_418 = (ComputationGraph *)0x0;
  _local_428 = (Expression)ZEXT816(0);
  cnn::RNNBuilder::start_new_sequence
            ((RNNBuilder *)ppiVar1,
             (vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_> *)local_428);
  if (local_428 != (undefined1  [8])0x0) {
    operator_delete((void *)local_428);
  }
  ppiVar1 = &sent[0xf].super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
             ._M_end_of_storage;
  if (((ulong)sent[0x10].super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_start & 0xfffffffd00000000) == 0) {
    *(undefined4 *)
     ((long)&sent[0x10].super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start + 4) = 1;
  }
  local_238 = (Expression *)ppiVar1;
  (**(code **)(*ppiVar1 + 0x12))(ppiVar1,cor);
  local_418 = (ComputationGraph *)0x0;
  _local_428 = (Expression)ZEXT816(0);
  cnn::RNNBuilder::start_new_sequence
            ((RNNBuilder *)ppiVar1,
             (vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_> *)local_428);
  pvVar19 = (vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
             *)((long)pvVar2 - (long)pvVar3 >> 2);
  if (local_428 != (undefined1  [8])0x0) {
    operator_delete((void *)local_428);
  }
  uVar13 = (ulong)pvVar19 & 0xffffffff;
  std::
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ::resize((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
            *)local_228,uVar13);
  cnn::expr::parameter((ComputationGraph *)(local_270 + 0x10),(Parameters *)cor);
  cnn::expr::parameter((ComputationGraph *)(local_370 + 0x10),(Parameters *)cor);
  cnn::expr::parameter((ComputationGraph *)local_270,(Parameters *)cor);
  cnn::expr::parameter((ComputationGraph *)local_370,(Parameters *)cor);
  cnn::expr::parameter((ComputationGraph *)(local_290 + 0x10),(Parameters *)cor);
  cnn::expr::parameter((ComputationGraph *)(local_390 + 0x10),(Parameters *)cor);
  cnn::expr::parameter((ComputationGraph *)local_290,(Parameters *)cor);
  cnn::expr::parameter((ComputationGraph *)local_390,(Parameters *)cor);
  cnn::expr::parameter((ComputationGraph *)(local_80 + 0x10),(Parameters *)cor);
  cnn::expr::parameter((ComputationGraph *)local_80,(Parameters *)cor);
  cnn::expr::parameter((ComputationGraph *)(local_a0 + 0x10),(Parameters *)cor);
  cnn::expr::parameter((ComputationGraph *)local_a0,(Parameters *)cor);
  cnn::expr::parameter((ComputationGraph *)(local_c0 + 0x10),(Parameters *)cor);
  cnn::expr::parameter((ComputationGraph *)&local_60,(Parameters *)cor);
  cnn::expr::parameter((ComputationGraph *)local_c0,(Parameters *)cor);
  cnn::expr::parameter((ComputationGraph *)local_d0,(Parameters *)cor);
  cnn::expr::parameter((ComputationGraph *)local_e0,(Parameters *)cor);
  cnn::expr::parameter((ComputationGraph *)(local_1f0 + 0x10),(Parameters *)cor);
  cnn::expr::parameter((ComputationGraph *)local_1f0,(Parameters *)cor);
  cnn::expr::parameter((ComputationGraph *)local_f0,(Parameters *)cor);
  std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>::vector
            (&local_1b8,uVar13,(allocator_type *)local_428);
  std::
  vector<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>,_std::allocator<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>_>_>
  ::vector(&local_328,uVar13,(allocator_type *)local_428);
  std::
  vector<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>,_std::allocator<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>_>_>
  ::vector(&local_2c0,uVar13,(allocator_type *)local_428);
  std::
  vector<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>,_std::allocator<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>_>_>
  ::vector(&local_180,uVar13,(allocator_type *)local_428);
  std::
  vector<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>,_std::allocator<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>_>_>
  ::vector(&local_108,uVar13,(allocator_type *)local_428);
  std::
  vector<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>,_std::allocator<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>_>_>
  ::vector(&local_1d0,uVar13,(allocator_type *)local_428);
  std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>::vector
            (&local_120,uVar13,(allocator_type *)local_428);
  std::
  vector<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>,_std::allocator<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>_>_>
  ::vector(&local_198,uVar13,(allocator_type *)local_428);
  std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>::vector
            (&local_138,uVar13,(allocator_type *)local_428);
  std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>::vector
            (&local_2d8,uVar13,(allocator_type *)local_428);
  std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>::vector
            (&local_310,uVar13,(allocator_type *)local_428);
  std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>::vector
            (&local_150,uVar13,(allocator_type *)local_428);
  local_1a0 = this;
  std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>::vector
            (&local_168,uVar13,(allocator_type *)local_428);
  local_330 = sent;
  local_220 = uVar13;
  std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>::vector
            (&local_250,uVar13,(allocator_type *)local_428);
  local_218 = ZEXT816(0) << 0x40;
  auVar24 = ZEXT1664(local_218);
  local_208 = (pointer)0x0;
  if ((int)pvVar19 != 0) {
    local_350 = (ExecutionEngine *)((ulong)pvVar19 & 0xffffffff);
    pEVar12 = (ExecutionEngine *)0x0;
    local_3a8 = pvVar19;
    do {
      pvVar8 = local_330;
      cnn::expr::lookup((ComputationGraph *)local_428,(LookupParameters *)cor,
                        (uint)(local_330->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                              super__Vector_impl_data._M_start);
      local_1b8.super__Vector_base<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>.
      _M_impl.super__Vector_impl_data._M_start[(long)pEVar12].pg = (ComputationGraph *)local_428;
      local_1b8.super__Vector_base<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>.
      _M_impl.super__Vector_impl_data._M_start[(long)pEVar12].i.t = pEStack_420._0_4_;
      if (eval == false) {
        auVar24 = ZEXT464((uint)pdrop);
        cnn::expr::dropout((expr *)local_428,
                           local_1b8.
                           super__Vector_base<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>
                           ._M_impl.super__Vector_impl_data._M_start + (long)pEVar12,pdrop);
        local_1b8.super__Vector_base<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>.
        _M_impl.super__Vector_impl_data._M_start[(long)pEVar12].pg = (ComputationGraph *)local_428;
        local_1b8.super__Vector_base<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>.
        _M_impl.super__Vector_impl_data._M_start[(long)pEVar12].i.t = pEStack_420._0_4_;
      }
      pvVar19 = (vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                 *)((long)pEVar12 * 0x18);
      pvVar2 = (local_3b0->
               super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
      local_398 = (RNNBuilder *)((long)pEVar12 * 0x10);
      local_340 = pEVar12;
      std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>::resize
                (local_328.
                 super__Vector_base<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>,_std::allocator<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start + (long)pEVar12,
                 *(long *)((long)&(pvVar19->
                                  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                  )._M_impl.super__Vector_impl_data._M_finish + (long)pvVar2) -
                 *(long *)((long)&(pvVar19->
                                  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                  )._M_impl.super__Vector_impl_data._M_start + (long)pvVar2) >> 2);
      pEVar7 = local_340;
      pvVar2 = (local_3b0->
               super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
      if (pvVar2[(long)local_340].super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_finish !=
          pvVar2[(long)local_340].super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_start) {
        uVar13 = 0;
        uVar20 = 1;
        do {
          cnn::expr::lookup((ComputationGraph *)local_428,(LookupParameters *)cor,
                            (uint)(pvVar8->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                                  super__Vector_impl_data._M_finish);
          pEVar10 = local_328.
                    super__Vector_base<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>,_std::allocator<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start[(long)pEVar7].
                    super__Vector_base<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          pEVar10[uVar13].pg = (ComputationGraph *)local_428;
          pEVar10[uVar13].i.t = pEStack_420._0_4_;
          if (eval == false) {
            auVar24 = ZEXT464((uint)pdrop);
            cnn::expr::dropout((expr *)local_428,
                               local_328.
                               super__Vector_base<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>,_std::allocator<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_start[(long)pEVar7].
                               super__Vector_base<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>
                               ._M_impl.super__Vector_impl_data._M_start + uVar13,pdrop);
            pEVar10 = local_328.
                      super__Vector_base<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>,_std::allocator<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start[(long)pEVar7].
                      super__Vector_base<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>
                      ._M_impl.super__Vector_impl_data._M_start;
            pEVar10[uVar13].pg = (ComputationGraph *)local_428;
            pEVar10[uVar13].i.t = pEStack_420._0_4_;
          }
          pvVar2 = (local_3b0->
                   super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                   )._M_impl.super__Vector_impl_data._M_start;
          bVar22 = uVar20 < (ulong)((long)pvVar2[(long)pEVar7].
                                          super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                          super__Vector_impl_data._M_finish -
                                    *(long *)&pvVar2[(long)pEVar7].
                                              super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                              super__Vector_impl_data >> 2);
          uVar13 = uVar20;
          uVar20 = (ulong)((int)uVar20 + 1);
        } while (bVar22);
      }
      std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>::resize
                (local_2c0.
                 super__Vector_base<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>,_std::allocator<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start + (long)pEVar12,
                 (long)local_328.
                       super__Vector_base<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>,_std::allocator<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start[(long)pEVar12].
                       super__Vector_base<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>
                       ._M_impl.super__Vector_impl_data._M_finish -
                 (long)local_328.
                       super__Vector_base<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>,_std::allocator<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start[(long)pEVar12].
                       super__Vector_base<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>
                       ._M_impl.super__Vector_impl_data._M_start >> 4);
      std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>::resize
                (local_180.
                 super__Vector_base<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>,_std::allocator<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start + (long)pEVar12,
                 (long)local_328.
                       super__Vector_base<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>,_std::allocator<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start[(long)pEVar12].
                       super__Vector_base<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>
                       ._M_impl.super__Vector_impl_data._M_finish -
                 (long)local_328.
                       super__Vector_base<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>,_std::allocator<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start[(long)pEVar12].
                       super__Vector_base<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>
                       ._M_impl.super__Vector_impl_data._M_start >> 4);
      std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>::resize
                (local_108.
                 super__Vector_base<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>,_std::allocator<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start + (long)pEVar12,
                 (long)local_328.
                       super__Vector_base<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>,_std::allocator<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start[(long)pEVar12].
                       super__Vector_base<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>
                       ._M_impl.super__Vector_impl_data._M_finish -
                 (long)local_328.
                       super__Vector_base<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>,_std::allocator<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start[(long)pEVar12].
                       super__Vector_base<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>
                       ._M_impl.super__Vector_impl_data._M_start >> 4);
      std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>::resize
                (local_1d0.
                 super__Vector_base<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>,_std::allocator<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start + (long)pEVar12,
                 (long)local_328.
                       super__Vector_base<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>,_std::allocator<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start[(long)pEVar12].
                       super__Vector_base<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>
                       ._M_impl.super__Vector_impl_data._M_finish -
                 (long)local_328.
                       super__Vector_base<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>,_std::allocator<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start[(long)pEVar12].
                       super__Vector_base<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>
                       ._M_impl.super__Vector_impl_data._M_start >> 4);
      pEVar10 = local_328.
                super__Vector_base<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>,_std::allocator<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start[(long)pEVar7].
                super__Vector_base<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>.
                _M_impl.super__Vector_impl_data._M_start;
      lVar14 = (long)local_328.
                     super__Vector_base<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>,_std::allocator<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start[(long)pEVar7].
                     super__Vector_base<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>
                     ._M_impl.super__Vector_impl_data._M_finish - (long)pEVar10;
      local_338 = pvVar19;
      if (lVar14 != 0) {
        uVar13 = lVar14 >> 4;
        lVar21 = 0;
        uVar20 = 0;
        do {
          dVar23 = auVar24._0_8_;
          if (lVar21 == 0) {
            if (uVar13 < 2) {
              local_418 = (ComputationGraph *)local_390._16_8_;
              local_410 = local_378;
              local_408 = (uint)pEVar10->pg;
              uStack_404 = (undefined4)((ulong)pEVar10->pg >> 0x20);
              local_400 = (pEVar10->i).t;
              local_3d0 = 5;
              local_3f8 = (ComputationGraph *)local_390._0_8_;
              local_3f0 = local_390._8_4_;
              local_3e8 = (ComputationGraph *)local_290._0_8_;
              local_3e0 = local_290._8_4_;
              local_3d8 = (undefined1  [8])local_428;
              cnn::expr::detail::f<cnn::Concatenate,std::initializer_list<cnn::expr::Expression>>
                        ((detail *)local_3c8,(initializer_list<cnn::expr::Expression> *)local_3d8);
            }
            else if (lVar14 == 0x20) {
              local_418 = (ComputationGraph *)local_390._16_8_;
              local_410 = local_378;
              local_408 = (uint)pEVar10->pg;
              uStack_404 = (undefined4)((ulong)pEVar10->pg >> 0x20);
              local_400 = (pEVar10->i).t;
              local_3f8 = pEVar10[1].pg;
              local_3f0 = pEVar10[1].i.t;
              local_3d0 = 5;
              local_3e8 = (ComputationGraph *)local_390._0_8_;
              local_3e0 = local_390._8_4_;
              local_3d8 = (undefined1  [8])local_428;
              cnn::expr::detail::f<cnn::Concatenate,std::initializer_list<cnn::expr::Expression>>
                        ((detail *)local_3c8,(initializer_list<cnn::expr::Expression> *)local_3d8);
            }
            else {
              local_418 = (ComputationGraph *)local_390._16_8_;
              local_410 = local_378;
              local_408 = (uint)pEVar10->pg;
              uStack_404 = (undefined4)((ulong)pEVar10->pg >> 0x20);
              local_400 = (pEVar10->i).t;
              local_3f8 = pEVar10[1].pg;
              local_3f0 = pEVar10[1].i.t;
              local_3e8 = pEVar10[2].pg;
              local_3e0 = pEVar10[2].i.t;
              local_3d0 = 5;
              local_3d8 = (undefined1  [8])local_428;
              cnn::expr::detail::f<cnn::Concatenate,std::initializer_list<cnn::expr::Expression>>
                        ((detail *)local_3c8,(initializer_list<cnn::expr::Expression> *)local_3d8);
            }
            pEVar10 = local_2c0.
                      super__Vector_base<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>,_std::allocator<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start[(long)pEVar7].
                      super__Vector_base<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>
                      ._M_impl.super__Vector_impl_data._M_start;
            pEVar10->pg = (ComputationGraph *)local_3c8._0_8_;
            (pEVar10->i).t = local_3c8._8_4_;
          }
          else if (lVar21 == 0x10) {
            if (uVar13 < 3) {
              local_418 = pEVar10->pg;
              local_410 = (pEVar10->i).t;
              local_408 = (uint)pEVar10[1].pg;
              uStack_404 = (undefined4)((ulong)pEVar10[1].pg >> 0x20);
              local_400 = pEVar10[1].i.t;
              local_3d0 = 5;
              local_3f8 = (ComputationGraph *)local_390._0_8_;
              local_3f0 = local_390._8_4_;
              local_3e8 = (ComputationGraph *)local_290._0_8_;
              local_3e0 = local_290._8_4_;
              local_3d8 = (undefined1  [8])local_428;
              cnn::expr::detail::f<cnn::Concatenate,std::initializer_list<cnn::expr::Expression>>
                        ((detail *)local_3c8,(initializer_list<cnn::expr::Expression> *)local_3d8);
            }
            else if (uVar13 == 3) {
              local_418 = pEVar10->pg;
              local_410 = (pEVar10->i).t;
              local_408 = (uint)pEVar10[1].pg;
              uStack_404 = (undefined4)((ulong)pEVar10[1].pg >> 0x20);
              local_400 = pEVar10[1].i.t;
              local_3f8 = pEVar10[2].pg;
              local_3f0 = pEVar10[2].i.t;
              local_3d0 = 5;
              local_3e8 = (ComputationGraph *)local_390._0_8_;
              local_3e0 = local_390._8_4_;
              local_3d8 = (undefined1  [8])local_428;
              cnn::expr::detail::f<cnn::Concatenate,std::initializer_list<cnn::expr::Expression>>
                        ((detail *)local_3c8,(initializer_list<cnn::expr::Expression> *)local_3d8);
            }
            else {
              local_418 = pEVar10->pg;
              local_410 = (pEVar10->i).t;
              local_408 = (uint)pEVar10[1].pg;
              uStack_404 = (undefined4)((ulong)pEVar10[1].pg >> 0x20);
              local_400 = pEVar10[1].i.t;
              local_3f8 = pEVar10[2].pg;
              local_3f0 = pEVar10[2].i.t;
              local_3e8 = pEVar10[3].pg;
              local_3e0 = pEVar10[3].i.t;
              local_3d0 = 5;
              local_3d8 = (undefined1  [8])local_428;
              cnn::expr::detail::f<cnn::Concatenate,std::initializer_list<cnn::expr::Expression>>
                        ((detail *)local_3c8,(initializer_list<cnn::expr::Expression> *)local_3d8);
            }
            pEVar10 = local_2c0.
                      super__Vector_base<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>,_std::allocator<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start[(long)pEVar7].
                      super__Vector_base<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>
                      ._M_impl.super__Vector_impl_data._M_start;
            pEVar10[1].pg = (ComputationGraph *)local_3c8._0_8_;
            pEVar10[1].i.t = local_3c8._8_4_;
          }
          else {
            if (uVar20 + 1 < uVar13) {
              if (uVar20 + 2 < uVar13) {
                pEStack_420._0_4_ = *(undefined4 *)((long)pEVar10 + lVar21 + -0x18);
                local_428 = (undefined1  [8])*(undefined8 *)((long)&pEVar10[-2].pg + lVar21);
                local_418 = *(ComputationGraph **)((long)&pEVar10[-1].pg + lVar21);
                local_410 = *(uint *)((long)pEVar10 + lVar21 + -8);
                uVar16 = *(undefined8 *)((long)&pEVar10->pg + lVar21);
                local_408 = (uint)uVar16;
                uStack_404 = (undefined4)((ulong)uVar16 >> 0x20);
                local_400 = *(undefined4 *)((long)&(pEVar10->i).t + lVar21);
                local_3f8 = *(ComputationGraph **)((long)&pEVar10[1].pg + lVar21);
                local_3f0 = *(uint *)((long)&pEVar10[1].i.t + lVar21);
                local_3e8 = *(ComputationGraph **)((long)&pEVar10[2].pg + lVar21);
                local_3e0 = *(uint *)((long)&pEVar10[2].i.t + lVar21);
                local_3d0 = 5;
                local_3d8 = (undefined1  [8])local_428;
                cnn::expr::detail::f<cnn::Concatenate,std::initializer_list<cnn::expr::Expression>>
                          ((detail *)local_3c8,(initializer_list<cnn::expr::Expression> *)local_3d8)
                ;
              }
              else {
                pEStack_420._0_4_ = *(undefined4 *)((long)pEVar10 + lVar21 + -0x18);
                local_428 = (undefined1  [8])*(undefined8 *)((long)&pEVar10[-2].pg + lVar21);
                local_418 = *(ComputationGraph **)((long)&pEVar10[-1].pg + lVar21);
                local_410 = *(uint *)((long)pEVar10 + lVar21 + -8);
                uVar16 = *(undefined8 *)((long)&pEVar10->pg + lVar21);
                local_408 = (uint)uVar16;
                uStack_404 = (undefined4)((ulong)uVar16 >> 0x20);
                local_400 = *(undefined4 *)((long)&(pEVar10->i).t + lVar21);
                local_3f8 = *(ComputationGraph **)((long)&pEVar10[1].pg + lVar21);
                local_3f0 = *(uint *)((long)&pEVar10[1].i.t + lVar21);
                local_3d0 = 5;
                local_3e8 = (ComputationGraph *)local_390._0_8_;
                local_3e0 = local_390._8_4_;
                local_3d8 = (undefined1  [8])local_428;
                cnn::expr::detail::f<cnn::Concatenate,std::initializer_list<cnn::expr::Expression>>
                          ((detail *)local_3c8,(initializer_list<cnn::expr::Expression> *)local_3d8)
                ;
              }
            }
            else {
              pEStack_420._0_4_ = *(undefined4 *)((long)pEVar10 + lVar21 + -0x18);
              local_428 = (undefined1  [8])*(undefined8 *)((long)&pEVar10[-2].pg + lVar21);
              local_418 = *(ComputationGraph **)((long)&pEVar10[-1].pg + lVar21);
              local_410 = *(uint *)((long)pEVar10 + lVar21 + -8);
              uVar16 = *(undefined8 *)((long)&pEVar10->pg + lVar21);
              local_408 = (uint)uVar16;
              uStack_404 = (undefined4)((ulong)uVar16 >> 0x20);
              local_400 = *(undefined4 *)((long)&(pEVar10->i).t + lVar21);
              local_3d0 = 5;
              local_3f8 = (ComputationGraph *)local_390._0_8_;
              local_3f0 = local_390._8_4_;
              local_3e8 = (ComputationGraph *)local_290._0_8_;
              local_3e0 = local_290._8_4_;
              local_3d8 = (undefined1  [8])local_428;
              cnn::expr::detail::f<cnn::Concatenate,std::initializer_list<cnn::expr::Expression>>
                        ((detail *)local_3c8,(initializer_list<cnn::expr::Expression> *)local_3d8);
            }
            pEVar10 = local_2c0.
                      super__Vector_base<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>,_std::allocator<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start[(long)pEVar7].
                      super__Vector_base<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>
                      ._M_impl.super__Vector_impl_data._M_start;
            *(undefined8 *)((long)&pEVar10->pg + lVar21) = local_3c8._0_8_;
            *(undefined4 *)((long)&(pEVar10->i).t + lVar21) = local_3c8._8_4_;
          }
          local_418 = (ComputationGraph *)local_80._16_8_;
          local_410 = local_68;
          pEVar10 = local_2c0.
                    super__Vector_base<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>,_std::allocator<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start[(long)pEVar7].
                    super__Vector_base<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          uVar16 = *(undefined8 *)((long)&pEVar10->pg + lVar21);
          local_408 = (uint)uVar16;
          uStack_404 = (undefined4)((ulong)uVar16 >> 0x20);
          local_400 = *(undefined4 *)((long)&(pEVar10->i).t + lVar21);
          local_2a0._M_len = 3;
          local_2a0._M_array = (iterator)local_428;
          cnn::expr::detail::f<cnn::AffineTransform,std::initializer_list<cnn::expr::Expression>>
                    ((detail *)local_3d8,&local_2a0);
          dVar23 = cnn::expr::tanh((expr *)local_3c8,dVar23);
          pEVar10 = local_180.
                    super__Vector_base<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>,_std::allocator<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start[(long)pEVar7].
                    super__Vector_base<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          *(undefined8 *)((long)&pEVar10->pg + lVar21) = local_3c8._0_8_;
          *(undefined4 *)((long)&(pEVar10->i).t + lVar21) = local_3c8._8_4_;
          pEStack_420._0_4_ = local_a8;
          local_428 = (undefined1  [8])local_c0._16_8_;
          local_418 = (ComputationGraph *)local_a0._16_8_;
          local_410 = local_88;
          pEVar10 = local_180.
                    super__Vector_base<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>,_std::allocator<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start[(long)pEVar7].
                    super__Vector_base<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          uVar16 = *(undefined8 *)((long)&pEVar10->pg + lVar21);
          local_408 = (uint)uVar16;
          uStack_404 = (undefined4)((ulong)uVar16 >> 0x20);
          local_400 = *(uint *)((long)&(pEVar10->i).t + lVar21);
          local_3f8 = (ComputationGraph *)local_a0._0_8_;
          local_3f0 = local_a0._8_4_;
          local_3e8 = *(ComputationGraph **)
                       ((long)&(local_1b8.
                                super__Vector_base<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>
                                ._M_impl.super__Vector_impl_data._M_start)->pg + (long)local_398);
          local_3e0 = *(uint *)((long)&((local_1b8.
                                         super__Vector_base<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>
                                         ._M_impl.super__Vector_impl_data._M_start)->i).t +
                               (long)local_398);
          local_2a0._M_len = 5;
          local_2a0._M_array = (iterator)local_428;
          cnn::expr::detail::f<cnn::AffineTransform,std::initializer_list<cnn::expr::Expression>>
                    ((detail *)local_3d8,&local_2a0);
          dVar23 = cnn::expr::tanh((expr *)local_3c8,dVar23);
          pEVar10 = local_108.
                    super__Vector_base<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>,_std::allocator<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start[(long)pEVar7].
                    super__Vector_base<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          *(undefined8 *)((long)&pEVar10->pg + lVar21) = local_3c8._0_8_;
          *(undefined4 *)((long)&(pEVar10->i).t + lVar21) = local_3c8._8_4_;
          cnn::expr::operator*
                    ((expr *)local_3c8,&local_60,
                     (Expression *)
                     ((long)&(local_108.
                              super__Vector_base<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>,_std::allocator<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start[(long)pEVar7].
                              super__Vector_base<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>
                              ._M_impl.super__Vector_impl_data._M_start)->pg + lVar21));
          auVar24._0_8_ = cnn::expr::exp((expr *)local_428,dVar23);
          auVar24._8_56_ = extraout_var;
          uVar20 = uVar20 + 1;
          lVar14 = *(long *)((long)&((local_1d0.
                                      super__Vector_base<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>,_std::allocator<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>_>_>
                                      ._M_impl.super__Vector_impl_data._M_start)->
                                    super__Vector_base<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>
                                    )._M_impl.super__Vector_impl_data._M_start + (long)local_338);
          *(undefined1 (*) [8])(lVar14 + lVar21) = local_428;
          *(uint *)(lVar14 + 8 + lVar21) = pEStack_420._0_4_;
          lVar21 = lVar21 + 0x10;
          pEVar10 = *(pointer *)
                     ((long)&((local_328.
                               super__Vector_base<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>,_std::allocator<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_start)->
                             super__Vector_base<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>
                             )._M_impl.super__Vector_impl_data._M_start + (long)local_338);
          lVar14 = *(long *)((long)&((local_328.
                                      super__Vector_base<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>,_std::allocator<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>_>_>
                                      ._M_impl.super__Vector_impl_data._M_start)->
                                    super__Vector_base<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>
                                    )._M_impl.super__Vector_impl_data._M_finish + (long)local_338) -
                   (long)pEVar10;
          uVar13 = lVar14 >> 4;
        } while (uVar20 < uVar13);
      }
      cnn::expr::detail::
      f<cnn::Sum,std::vector<cnn::expr::Expression,std::allocator<cnn::expr::Expression>>>
                ((detail *)local_428,
                 local_1d0.
                 super__Vector_base<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>,_std::allocator<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start + (long)pEVar7);
      pvVar19 = local_338;
      *(undefined1 (*) [8])
       ((long)&(local_120.
                super__Vector_base<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>.
                _M_impl.super__Vector_impl_data._M_start)->pg + (long)local_398) = local_428;
      *(uint *)((long)&((local_120.
                         super__Vector_base<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>
                         ._M_impl.super__Vector_impl_data._M_start)->i).t + (long)local_398) =
           pEStack_420._0_4_;
      std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>::resize
                ((vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_> *)
                 ((long)&((local_198.
                           super__Vector_base<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>,_std::allocator<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start)->
                         super__Vector_base<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>
                         )._M_impl.super__Vector_impl_data._M_start + (long)local_338),
                 *(long *)((long)&((local_328.
                                    super__Vector_base<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>,_std::allocator<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start)->
                                  super__Vector_base<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>
                                  )._M_impl.super__Vector_impl_data._M_finish + (long)local_338) -
                 *(long *)((long)&((local_328.
                                    super__Vector_base<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>,_std::allocator<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start)->
                                  super__Vector_base<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>
                                  )._M_impl.super__Vector_impl_data._M_start + (long)local_338) >> 4
                );
      if (local_328.
          super__Vector_base<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>,_std::allocator<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start[(long)pEVar7].
          super__Vector_base<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>._M_impl.
          super__Vector_impl_data._M_finish !=
          local_328.
          super__Vector_base<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>,_std::allocator<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start[(long)pEVar7].
          super__Vector_base<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>._M_impl.
          super__Vector_impl_data._M_start) {
        uVar13 = 0;
        uVar20 = 1;
        do {
          lVar21 = uVar13 * 0x10;
          lVar14 = *(long *)((long)&((local_180.
                                      super__Vector_base<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>,_std::allocator<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>_>_>
                                      ._M_impl.super__Vector_impl_data._M_start)->
                                    super__Vector_base<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>
                                    )._M_impl.super__Vector_impl_data._M_start + (long)pvVar19);
          cnn::expr::cdiv((expr *)local_3c8,
                          (Expression *)
                          (*(long *)((long)&((local_1d0.
                                              super__Vector_base<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>,_std::allocator<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>_>_>
                                              ._M_impl.super__Vector_impl_data._M_start)->
                                            super__Vector_base<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>
                                            )._M_impl.super__Vector_impl_data._M_start +
                                    (long)pvVar19) + lVar21),
                          (Expression *)
                          ((long)&(local_120.
                                   super__Vector_base<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>
                                   ._M_impl.super__Vector_impl_data._M_start)->pg + (long)local_398)
                         );
          cnn::expr::cwise_multiply
                    ((expr *)local_428,(Expression *)(lVar14 + lVar21),(Expression *)local_3c8);
          lVar14 = *(long *)((long)&((local_198.
                                      super__Vector_base<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>,_std::allocator<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>_>_>
                                      ._M_impl.super__Vector_impl_data._M_start)->
                                    super__Vector_base<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>
                                    )._M_impl.super__Vector_impl_data._M_start + (long)pvVar19);
          *(undefined1 (*) [8])(lVar14 + lVar21) = local_428;
          *(uint *)(lVar14 + 8 + lVar21) = pEStack_420._0_4_;
          bVar22 = uVar20 < (ulong)(*(long *)((long)&((local_328.
                                                                                                              
                                                  super__Vector_base<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>,_std::allocator<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start)->
                                                  super__Vector_base<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>
                                                  )._M_impl.super__Vector_impl_data._M_finish +
                                             (long)pvVar19) -
                                    *(long *)((long)&((local_328.
                                                                                                              
                                                  super__Vector_base<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>,_std::allocator<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start)->
                                                  super__Vector_base<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>
                                                  )._M_impl.super__Vector_impl_data._M_start +
                                             (long)pvVar19) >> 4);
          uVar13 = uVar20;
          uVar20 = (ulong)((int)uVar20 + 1);
        } while (bVar22);
      }
      cnn::expr::detail::
      f<cnn::Sum,std::vector<cnn::expr::Expression,std::allocator<cnn::expr::Expression>>>
                ((detail *)local_428,
                 local_198.
                 super__Vector_base<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>,_std::allocator<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start + (long)pEVar7);
      pvVar19 = local_3a8;
      *(undefined1 (*) [8])
       ((long)&(local_138.
                super__Vector_base<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>.
                _M_impl.super__Vector_impl_data._M_start)->pg + (long)local_398) = local_428;
      pEVar12 = (ExecutionEngine *)((long)&local_340->_vptr_ExecutionEngine + 1);
      *(uint *)((long)&((local_138.
                         super__Vector_base<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>
                         ._M_impl.super__Vector_impl_data._M_start)->i).t + (long)local_398) =
           pEStack_420._0_4_;
    } while (pEVar12 != local_350);
    uVar17 = (uint)local_3a8;
    if (uVar17 != 0) {
      lVar14 = 0;
      lVar21 = (long)local_350 << 4;
      do {
        pEStack_420._0_4_ =
             *(undefined4 *)
              ((long)&((local_138.
                        super__Vector_base<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>
                        ._M_impl.super__Vector_impl_data._M_start)->i).t + lVar14);
        local_428 = (undefined1  [8])
                    *(undefined8 *)
                     ((long)&(local_138.
                              super__Vector_base<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>
                              ._M_impl.super__Vector_impl_data._M_start)->pg + lVar14);
        local_418 = *(ComputationGraph **)
                     ((long)&(local_1b8.
                              super__Vector_base<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>
                              ._M_impl.super__Vector_impl_data._M_start)->pg + lVar14);
        local_410 = *(uint *)((long)&((local_1b8.
                                       super__Vector_base<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>
                                       ._M_impl.super__Vector_impl_data._M_start)->i).t + lVar14);
        local_3d0 = 2;
        local_3d8 = (undefined1  [8])local_428;
        cnn::expr::detail::f<cnn::Concatenate,std::initializer_list<cnn::expr::Expression>>
                  ((detail *)local_3c8,(initializer_list<cnn::expr::Expression> *)local_3d8);
        *(undefined8 *)
         ((long)&(local_2d8.
                  super__Vector_base<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>.
                  _M_impl.super__Vector_impl_data._M_start)->pg + lVar14) = local_3c8._0_8_;
        *(undefined4 *)
         ((long)&((local_2d8.
                   super__Vector_base<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>
                   ._M_impl.super__Vector_impl_data._M_start)->i).t + lVar14) = local_3c8._8_4_;
        lVar14 = lVar14 + 0x10;
      } while (lVar21 != lVar14);
      if (uVar17 != 0) {
        uVar13 = 2;
        lVar14 = 0;
        do {
          if (lVar14 == 0) {
            if ((uint)local_3a8 == 2) {
              pEStack_420._0_4_ = local_258;
              local_428 = (undefined1  [8])local_270._16_8_;
              local_418 = (ComputationGraph *)local_370._16_8_;
              local_410 = local_358;
              local_408 = (uint)(local_2d8.
                                 super__Vector_base<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>
                                 ._M_impl.super__Vector_impl_data._M_start)->pg;
              uStack_404 = (undefined4)
                           ((ulong)(local_2d8.
                                    super__Vector_base<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>
                                    ._M_impl.super__Vector_impl_data._M_start)->pg >> 0x20);
              local_400 = ((local_2d8.
                            super__Vector_base<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>
                            ._M_impl.super__Vector_impl_data._M_start)->i).t;
              local_3f8 = local_2d8.
                          super__Vector_base<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>
                          ._M_impl.super__Vector_impl_data._M_start[1].pg;
              local_3f0 = local_2d8.
                          super__Vector_base<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>
                          ._M_impl.super__Vector_impl_data._M_start[1].i.t;
              local_3e8 = (ComputationGraph *)local_370._0_8_;
              local_3e0 = local_370._8_4_;
              local_3d0 = 5;
              local_3d8 = (undefined1  [8])local_428;
              cnn::expr::detail::f<cnn::Concatenate,std::initializer_list<cnn::expr::Expression>>
                        ((detail *)local_3c8,(initializer_list<cnn::expr::Expression> *)local_3d8);
            }
            else if ((uint)local_3a8 == 1) {
              pEStack_420._0_4_ = local_258;
              local_428 = (undefined1  [8])local_270._16_8_;
              local_418 = (ComputationGraph *)local_370._16_8_;
              local_410 = local_358;
              local_408 = (uint)(local_2d8.
                                 super__Vector_base<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>
                                 ._M_impl.super__Vector_impl_data._M_start)->pg;
              uStack_404 = (undefined4)
                           ((ulong)(local_2d8.
                                    super__Vector_base<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>
                                    ._M_impl.super__Vector_impl_data._M_start)->pg >> 0x20);
              local_400 = ((local_2d8.
                            super__Vector_base<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>
                            ._M_impl.super__Vector_impl_data._M_start)->i).t;
              local_3f8 = (ComputationGraph *)local_370._0_8_;
              local_3f0 = local_370._8_4_;
              local_3e8 = (ComputationGraph *)local_270._0_8_;
              local_3e0 = local_270._8_4_;
              local_3d0 = 5;
              local_3d8 = (undefined1  [8])local_428;
              cnn::expr::detail::f<cnn::Concatenate,std::initializer_list<cnn::expr::Expression>>
                        ((detail *)local_3c8,(initializer_list<cnn::expr::Expression> *)local_3d8);
            }
            else {
              pEStack_420._0_4_ = local_258;
              local_428 = (undefined1  [8])local_270._16_8_;
              local_418 = (ComputationGraph *)local_370._16_8_;
              local_410 = local_358;
              local_408 = (uint)(local_2d8.
                                 super__Vector_base<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>
                                 ._M_impl.super__Vector_impl_data._M_start)->pg;
              uStack_404 = (undefined4)
                           ((ulong)(local_2d8.
                                    super__Vector_base<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>
                                    ._M_impl.super__Vector_impl_data._M_start)->pg >> 0x20);
              local_400 = ((local_2d8.
                            super__Vector_base<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>
                            ._M_impl.super__Vector_impl_data._M_start)->i).t;
              local_3f8 = local_2d8.
                          super__Vector_base<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>
                          ._M_impl.super__Vector_impl_data._M_start[1].pg;
              local_3f0 = local_2d8.
                          super__Vector_base<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>
                          ._M_impl.super__Vector_impl_data._M_start[1].i.t;
              local_3e8 = local_2d8.
                          super__Vector_base<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>
                          ._M_impl.super__Vector_impl_data._M_start[2].pg;
              local_3e0 = local_2d8.
                          super__Vector_base<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>
                          ._M_impl.super__Vector_impl_data._M_start[2].i.t;
              local_3d0 = 5;
              local_3d8 = (undefined1  [8])local_428;
              cnn::expr::detail::f<cnn::Concatenate,std::initializer_list<cnn::expr::Expression>>
                        ((detail *)local_3c8,(initializer_list<cnn::expr::Expression> *)local_3d8);
            }
            (local_310.
             super__Vector_base<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>.
             _M_impl.super__Vector_impl_data._M_start)->pg = (ComputationGraph *)local_3c8._0_8_;
            ((local_310.
              super__Vector_base<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>.
              _M_impl.super__Vector_impl_data._M_start)->i).t = local_3c8._8_4_;
          }
          else if (lVar14 == 0x10) {
            if (uVar17 < 3) {
              pEStack_420._0_4_ = local_358;
              local_428 = (undefined1  [8])local_370._16_8_;
              local_418 = (local_2d8.
                           super__Vector_base<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>
                           ._M_impl.super__Vector_impl_data._M_start)->pg;
              local_410 = ((local_2d8.
                            super__Vector_base<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>
                            ._M_impl.super__Vector_impl_data._M_start)->i).t;
              local_408 = (uint)local_2d8.
                                super__Vector_base<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>
                                ._M_impl.super__Vector_impl_data._M_start[1].pg;
              uStack_404 = (undefined4)
                           ((ulong)local_2d8.
                                   super__Vector_base<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>
                                   ._M_impl.super__Vector_impl_data._M_start[1].pg >> 0x20);
              local_400 = local_2d8.
                          super__Vector_base<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>
                          ._M_impl.super__Vector_impl_data._M_start[1].i.t;
              local_3f8 = (ComputationGraph *)local_370._0_8_;
              local_3f0 = local_370._8_4_;
              local_3e8 = (ComputationGraph *)local_270._0_8_;
              local_3e0 = local_270._8_4_;
              local_3d0 = 5;
              local_3d8 = (undefined1  [8])local_428;
              cnn::expr::detail::f<cnn::Concatenate,std::initializer_list<cnn::expr::Expression>>
                        ((detail *)local_3c8,(initializer_list<cnn::expr::Expression> *)local_3d8);
            }
            else if ((uint)local_3a8 < 4) {
              pEStack_420._0_4_ = local_358;
              local_428 = (undefined1  [8])local_370._16_8_;
              local_418 = (local_2d8.
                           super__Vector_base<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>
                           ._M_impl.super__Vector_impl_data._M_start)->pg;
              local_410 = ((local_2d8.
                            super__Vector_base<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>
                            ._M_impl.super__Vector_impl_data._M_start)->i).t;
              local_408 = (uint)local_2d8.
                                super__Vector_base<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>
                                ._M_impl.super__Vector_impl_data._M_start[1].pg;
              uStack_404 = (undefined4)
                           ((ulong)local_2d8.
                                   super__Vector_base<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>
                                   ._M_impl.super__Vector_impl_data._M_start[1].pg >> 0x20);
              local_400 = local_2d8.
                          super__Vector_base<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>
                          ._M_impl.super__Vector_impl_data._M_start[1].i.t;
              local_3f8 = local_2d8.
                          super__Vector_base<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>
                          ._M_impl.super__Vector_impl_data._M_start[2].pg;
              local_3f0 = local_2d8.
                          super__Vector_base<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>
                          ._M_impl.super__Vector_impl_data._M_start[2].i.t;
              local_3e8 = (ComputationGraph *)local_370._0_8_;
              local_3e0 = local_370._8_4_;
              local_3d0 = 5;
              local_3d8 = (undefined1  [8])local_428;
              cnn::expr::detail::f<cnn::Concatenate,std::initializer_list<cnn::expr::Expression>>
                        ((detail *)local_3c8,(initializer_list<cnn::expr::Expression> *)local_3d8);
            }
            else {
              pEStack_420._0_4_ = local_358;
              local_428 = (undefined1  [8])local_370._16_8_;
              local_418 = (local_2d8.
                           super__Vector_base<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>
                           ._M_impl.super__Vector_impl_data._M_start)->pg;
              local_410 = ((local_2d8.
                            super__Vector_base<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>
                            ._M_impl.super__Vector_impl_data._M_start)->i).t;
              local_408 = (uint)local_2d8.
                                super__Vector_base<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>
                                ._M_impl.super__Vector_impl_data._M_start[1].pg;
              uStack_404 = (undefined4)
                           ((ulong)local_2d8.
                                   super__Vector_base<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>
                                   ._M_impl.super__Vector_impl_data._M_start[1].pg >> 0x20);
              local_400 = local_2d8.
                          super__Vector_base<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>
                          ._M_impl.super__Vector_impl_data._M_start[1].i.t;
              local_3f8 = local_2d8.
                          super__Vector_base<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>
                          ._M_impl.super__Vector_impl_data._M_start[2].pg;
              local_3f0 = local_2d8.
                          super__Vector_base<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>
                          ._M_impl.super__Vector_impl_data._M_start[2].i.t;
              local_3e8 = local_2d8.
                          super__Vector_base<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>
                          ._M_impl.super__Vector_impl_data._M_start[3].pg;
              local_3e0 = local_2d8.
                          super__Vector_base<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>
                          ._M_impl.super__Vector_impl_data._M_start[3].i.t;
              local_3d0 = 5;
              local_3d8 = (undefined1  [8])local_428;
              cnn::expr::detail::f<cnn::Concatenate,std::initializer_list<cnn::expr::Expression>>
                        ((detail *)local_3c8,(initializer_list<cnn::expr::Expression> *)local_3d8);
            }
            local_310.
            super__Vector_base<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>.
            _M_impl.super__Vector_impl_data._M_start[1].pg = (ComputationGraph *)local_3c8._0_8_;
            local_310.
            super__Vector_base<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>.
            _M_impl.super__Vector_impl_data._M_start[1].i.t = local_3c8._8_4_;
          }
          else {
            if (uVar13 - 1 < ((ulong)pvVar19 & 0xffffffff)) {
              if (uVar13 < ((ulong)pvVar19 & 0xffffffff)) {
                pEStack_420._0_4_ =
                     *(undefined4 *)
                      ((long)local_2d8.
                             super__Vector_base<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>
                             ._M_impl.super__Vector_impl_data._M_start + lVar14 + -0x18);
                local_428 = (undefined1  [8])
                            *(undefined8 *)
                             ((long)&local_2d8.
                                     super__Vector_base<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>
                                     ._M_impl.super__Vector_impl_data._M_start[-2].pg + lVar14);
                local_418 = *(ComputationGraph **)
                             ((long)&local_2d8.
                                     super__Vector_base<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>
                                     ._M_impl.super__Vector_impl_data._M_start[-1].pg + lVar14);
                local_410 = *(uint *)((long)local_2d8.
                                            super__Vector_base<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>
                                            ._M_impl.super__Vector_impl_data._M_start + lVar14 + -8)
                ;
                uVar16 = *(undefined8 *)
                          ((long)&(local_2d8.
                                   super__Vector_base<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>
                                   ._M_impl.super__Vector_impl_data._M_start)->pg + lVar14);
                local_408 = (uint)uVar16;
                uStack_404 = (undefined4)((ulong)uVar16 >> 0x20);
                local_400 = *(uint *)((long)&((local_2d8.
                                               super__Vector_base<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>
                                               ._M_impl.super__Vector_impl_data._M_start)->i).t +
                                     lVar14);
                local_3f8 = *(ComputationGraph **)
                             ((long)&local_2d8.
                                     super__Vector_base<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>
                                     ._M_impl.super__Vector_impl_data._M_start[1].pg + lVar14);
                local_3f0 = *(uint *)((long)&local_2d8.
                                             super__Vector_base<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>
                                             ._M_impl.super__Vector_impl_data._M_start[1].i.t +
                                     lVar14);
                local_3e8 = *(ComputationGraph **)
                             ((long)&local_2d8.
                                     super__Vector_base<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>
                                     ._M_impl.super__Vector_impl_data._M_start[2].pg + lVar14);
                local_3e0 = *(uint *)((long)&local_2d8.
                                             super__Vector_base<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>
                                             ._M_impl.super__Vector_impl_data._M_start[2].i.t +
                                     lVar14);
                local_3d0 = 5;
                local_3d8 = (undefined1  [8])local_428;
                cnn::expr::detail::f<cnn::Concatenate,std::initializer_list<cnn::expr::Expression>>
                          ((detail *)local_3c8,(initializer_list<cnn::expr::Expression> *)local_3d8)
                ;
              }
              else {
                pEStack_420._0_4_ =
                     *(undefined4 *)
                      ((long)local_2d8.
                             super__Vector_base<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>
                             ._M_impl.super__Vector_impl_data._M_start + lVar14 + -0x18);
                local_428 = (undefined1  [8])
                            *(undefined8 *)
                             ((long)&local_2d8.
                                     super__Vector_base<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>
                                     ._M_impl.super__Vector_impl_data._M_start[-2].pg + lVar14);
                local_418 = *(ComputationGraph **)
                             ((long)&local_2d8.
                                     super__Vector_base<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>
                                     ._M_impl.super__Vector_impl_data._M_start[-1].pg + lVar14);
                local_410 = *(uint *)((long)local_2d8.
                                            super__Vector_base<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>
                                            ._M_impl.super__Vector_impl_data._M_start + lVar14 + -8)
                ;
                uVar16 = *(undefined8 *)
                          ((long)&(local_2d8.
                                   super__Vector_base<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>
                                   ._M_impl.super__Vector_impl_data._M_start)->pg + lVar14);
                local_408 = (uint)uVar16;
                uStack_404 = (undefined4)((ulong)uVar16 >> 0x20);
                local_400 = *(uint *)((long)&((local_2d8.
                                               super__Vector_base<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>
                                               ._M_impl.super__Vector_impl_data._M_start)->i).t +
                                     lVar14);
                local_3f8 = *(ComputationGraph **)
                             ((long)&local_2d8.
                                     super__Vector_base<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>
                                     ._M_impl.super__Vector_impl_data._M_start[1].pg + lVar14);
                local_3f0 = *(uint *)((long)&local_2d8.
                                             super__Vector_base<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>
                                             ._M_impl.super__Vector_impl_data._M_start[1].i.t +
                                     lVar14);
                local_3e8 = (ComputationGraph *)local_370._0_8_;
                local_3e0 = local_370._8_4_;
                local_3d0 = 5;
                local_3d8 = (undefined1  [8])local_428;
                cnn::expr::detail::f<cnn::Concatenate,std::initializer_list<cnn::expr::Expression>>
                          ((detail *)local_3c8,(initializer_list<cnn::expr::Expression> *)local_3d8)
                ;
              }
            }
            else {
              pEStack_420._0_4_ =
                   *(undefined4 *)
                    ((long)local_2d8.
                           super__Vector_base<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>
                           ._M_impl.super__Vector_impl_data._M_start + lVar14 + -0x18);
              local_428 = (undefined1  [8])
                          *(undefined8 *)
                           ((long)&local_2d8.
                                   super__Vector_base<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>
                                   ._M_impl.super__Vector_impl_data._M_start[-2].pg + lVar14);
              local_418 = *(ComputationGraph **)
                           ((long)&local_2d8.
                                   super__Vector_base<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>
                                   ._M_impl.super__Vector_impl_data._M_start[-1].pg + lVar14);
              local_410 = *(uint *)((long)local_2d8.
                                          super__Vector_base<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>
                                          ._M_impl.super__Vector_impl_data._M_start + lVar14 + -8);
              uVar16 = *(undefined8 *)
                        ((long)&(local_2d8.
                                 super__Vector_base<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>
                                 ._M_impl.super__Vector_impl_data._M_start)->pg + lVar14);
              local_408 = (uint)uVar16;
              uStack_404 = (undefined4)((ulong)uVar16 >> 0x20);
              local_400 = *(uint *)((long)&((local_2d8.
                                             super__Vector_base<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>
                                             ._M_impl.super__Vector_impl_data._M_start)->i).t +
                                   lVar14);
              local_3f8 = (ComputationGraph *)local_370._0_8_;
              local_3f0 = local_370._8_4_;
              local_3e8 = (ComputationGraph *)local_270._0_8_;
              local_3e0 = local_270._8_4_;
              local_3d0 = 5;
              local_3d8 = (undefined1  [8])local_428;
              cnn::expr::detail::f<cnn::Concatenate,std::initializer_list<cnn::expr::Expression>>
                        ((detail *)local_3c8,(initializer_list<cnn::expr::Expression> *)local_3d8);
            }
            *(undefined8 *)
             ((long)&(local_310.
                      super__Vector_base<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>
                      ._M_impl.super__Vector_impl_data._M_start)->pg + lVar14) = local_3c8._0_8_;
            *(undefined4 *)
             ((long)&((local_310.
                       super__Vector_base<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>
                       ._M_impl.super__Vector_impl_data._M_start)->i).t + lVar14) = local_3c8._8_4_;
          }
          pvVar6 = local_3a8;
          lVar14 = lVar14 + 0x10;
          uVar13 = uVar13 + 1;
        } while (lVar21 != lVar14);
        iVar18 = (int)local_3a8;
        if (iVar18 != 0) {
          lVar14 = 0;
          do {
            cnn::RNNBuilder::add_input((RNNBuilder *)local_428,local_230);
            *(undefined1 (*) [8])
             ((long)&(local_150.
                      super__Vector_base<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>
                      ._M_impl.super__Vector_impl_data._M_start)->pg + lVar14) = local_428;
            *(uint *)((long)&((local_150.
                               super__Vector_base<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>
                               ._M_impl.super__Vector_impl_data._M_start)->i).t + lVar14) =
                 pEStack_420._0_4_;
            lVar14 = lVar14 + 0x10;
          } while (lVar21 != lVar14);
          pvVar19 = pvVar6;
          if (iVar18 != 0) {
            do {
              pvVar19 = (vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                         *)((long)&pvVar19[-1].
                                   super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_end_of_storage + 7);
              uVar13 = (ulong)pvVar19 & 0xffffffff;
              cnn::RNNBuilder::add_input((RNNBuilder *)local_428,local_238);
              local_350 = (ExecutionEngine *)((long)&local_350[-1].cg + 7);
              local_168.
              super__Vector_base<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>.
              _M_impl.super__Vector_impl_data._M_start[uVar13].pg = (ComputationGraph *)local_428;
              local_168.
              super__Vector_base<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>.
              _M_impl.super__Vector_impl_data._M_start[uVar13].i.t = pEStack_420._0_4_;
            } while (local_350 != (ExecutionEngine *)0x0);
            local_350 = (ExecutionEngine *)0x0;
            if (iVar18 != 0) {
              lVar14 = 0;
              do {
                pEStack_420._0_4_ =
                     *(undefined4 *)
                      ((long)&((local_150.
                                super__Vector_base<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>
                                ._M_impl.super__Vector_impl_data._M_start)->i).t + lVar14);
                local_428 = (undefined1  [8])
                            *(undefined8 *)
                             ((long)&(local_150.
                                      super__Vector_base<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>
                                      ._M_impl.super__Vector_impl_data._M_start)->pg + lVar14);
                local_418 = *(ComputationGraph **)
                             ((long)&(local_168.
                                      super__Vector_base<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>
                                      ._M_impl.super__Vector_impl_data._M_start)->pg + lVar14);
                local_410 = *(uint *)((long)&((local_168.
                                               super__Vector_base<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>
                                               ._M_impl.super__Vector_impl_data._M_start)->i).t +
                                     lVar14);
                local_3d0 = 2;
                local_3d8 = (undefined1  [8])local_428;
                EVar27 = cnn::expr::detail::
                         f<cnn::Concatenate,std::initializer_list<cnn::expr::Expression>>
                                   ((detail *)local_3c8,
                                    (initializer_list<cnn::expr::Expression> *)local_3d8);
                pvVar19 = EVar27._8_8_;
                *(undefined8 *)
                 ((long)&(local_250.
                          super__Vector_base<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>
                          ._M_impl.super__Vector_impl_data._M_start)->pg + lVar14) = local_3c8._0_8_
                ;
                *(undefined4 *)
                 ((long)&((local_250.
                           super__Vector_base<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>
                           ._M_impl.super__Vector_impl_data._M_start)->i).t + lVar14) =
                     local_3c8._8_4_;
                lVar14 = lVar14 + 0x10;
              } while (lVar21 != lVar14);
              if (iVar18 != 0) {
                local_2a8 = (vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                             *)((ulong)pvVar6 & 0xffffffff);
                lVar14 = (long)local_2a8 << 4;
                local_3a8 = (vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                             *)0x0;
                local_398 = (RNNBuilder *)(local_330 + 0x18);
                do {
                  this_01 = local_398;
                  if (((ulong)local_330[0x18].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_finish & 0xfffffffd00000000) == 0) {
                    *(undefined4 *)
                     ((long)&local_330[0x18].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                             super__Vector_impl_data._M_finish + 4) = 1;
                  }
                  (*local_398->_vptr_RNNBuilder[9])(local_398,cor,pvVar19);
                  _local_428 = (Expression)(ZEXT816(0) << 0x40);
                  auVar25 = ZEXT1664((undefined1  [16])_local_428);
                  local_418 = (ComputationGraph *)0x0;
                  cnn::RNNBuilder::start_new_sequence
                            (this_01,(vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>
                                      *)local_428);
                  if (local_428 != (undefined1  [8])0x0) {
                    operator_delete((void *)local_428);
                  }
                  if (in_stack_00000028 == '\0') {
                    uStack_40c = 1;
                    local_408 = 1;
                    local_428._0_4_ = HIDDEN_DIM;
                    cnn::expr::zeroes((expr *)local_3d8,(ComputationGraph *)cor,(Dim *)local_428);
                    local_3b0 = (vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                 *)((ulong)local_3b0 & 0xffffffff00000000);
                    do {
                      if (6 < (int)local_3b0) break;
                      std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>::
                      vector((vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>
                              *)local_3c8,local_220,(allocator_type *)local_428);
                      lVar21 = 0;
                      do {
                        dVar23 = auVar25._0_8_;
                        cnn::expr::operator*
                                  ((expr *)&local_50,(Expression *)local_c0,
                                   (Expression *)
                                   ((long)&(local_250.
                                            super__Vector_base<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>
                                            ._M_impl.super__Vector_impl_data._M_start)->pg + lVar21)
                                  );
                        cnn::expr::operator*
                                  ((expr *)&local_200,(Expression *)local_d0,(Expression *)local_3d8
                                  );
                        cnn::expr::operator+((expr *)&local_40,&local_50,(Expression *)&local_200);
                        auVar25._0_8_ = cnn::expr::tanh((expr *)&local_2a0,dVar23);
                        auVar25._8_56_ = extraout_var_02;
                        cnn::expr::operator*
                                  ((expr *)local_428,(Expression *)local_e0,(Expression *)&local_2a0
                                  );
                        dVar23 = auVar25._0_8_;
                        *(undefined1 (*) [8])
                         ((long)&(((vector<cnn::Node_*,_std::allocator<cnn::Node_*>_> *)
                                  local_3c8._0_8_)->
                                 super__Vector_base<cnn::Node_*,_std::allocator<cnn::Node_*>_>).
                                 _M_impl.super__Vector_impl_data._M_start + lVar21) = local_428;
                        *(uint *)((long)&(((vector<cnn::Node_*,_std::allocator<cnn::Node_*>_> *)
                                          local_3c8._0_8_)->
                                         super__Vector_base<cnn::Node_*,_std::allocator<cnn::Node_*>_>
                                         )._M_impl.super__Vector_impl_data._M_finish + lVar21) =
                             pEStack_420._0_4_;
                        lVar21 = lVar21 + 0x10;
                      } while (lVar14 != lVar21);
                      cnn::expr::detail::
                      f<cnn::ConcatenateColumns,std::vector<cnn::expr::Expression,std::allocator<cnn::expr::Expression>>>
                                ((detail *)&local_2a0,&local_250);
                      cnn::expr::detail::
                      f<cnn::Concatenate,std::vector<cnn::expr::Expression,std::allocator<cnn::expr::Expression>>>
                                ((detail *)local_428,
                                 (vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>
                                  *)local_3c8);
                      cnn::expr::softmax((expr *)&local_40,(Expression *)local_428);
                      cnn::expr::transpose((expr *)&local_200,&local_40);
                      cnn::expr::transpose((expr *)&local_2e8,(Expression *)&local_2a0);
                      cnn::expr::operator*((expr *)&local_50,(Expression *)&local_200,&local_2e8);
                      cnn::expr::transpose((expr *)local_428,&local_50);
                      local_418 = (ComputationGraph *)local_428;
                      local_410 = pEStack_420._0_4_;
                      local_200._M_len = 2;
                      pEStack_420._0_4_ =
                           local_250.
                           super__Vector_base<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>
                           ._M_impl.super__Vector_impl_data._M_start[(long)local_3a8].i.t;
                      local_428 = (undefined1  [8])
                                  local_250.
                                  super__Vector_base<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>
                                  ._M_impl.super__Vector_impl_data._M_start[(long)local_3a8].pg;
                      local_200._M_array = (iterator)local_428;
                      cnn::expr::detail::
                      f<cnn::Concatenate,std::initializer_list<cnn::expr::Expression>>
                                ((detail *)&local_50,&local_200);
                      cnn::RNNBuilder::add_input((RNNBuilder *)local_428,(Expression *)local_398);
                      EVar27 = _local_428;
                      local_400 = pEStack_420._0_4_;
                      local_2f8._M_len = 3;
                      local_3d8 = local_428;
                      pEStack_420._0_4_ = local_1f0._8_4_;
                      local_428 = (undefined1  [8])local_1f0._0_8_;
                      local_418 = (ComputationGraph *)local_1f0._16_8_;
                      local_410 = local_1d8;
                      local_408 = (uint)EVar27.pg;
                      uStack_404 = EVar27.pg._4_4_;
                      local_3d0 = CONCAT44(local_3d0._4_4_,local_400);
                      local_2f8._M_array = (iterator)local_428;
                      cnn::expr::detail::
                      f<cnn::AffineTransform,std::initializer_list<cnn::expr::Expression>>
                                ((detail *)&local_2e8,&local_2f8);
                      auVar25._0_8_ = cnn::expr::tanh((expr *)&local_200,dVar23);
                      auVar25._8_56_ = extraout_var_03;
                      cnn::expr::operator*
                                ((expr *)&local_2e8,(Expression *)local_f0,(Expression *)&local_200)
                      ;
                      if (predict == (uint *)0x0) {
                        bVar22 = true;
                      }
                      else {
                        pTVar11 = cnn::ComputationGraph::incremental_forward
                                            ((ComputationGraph *)cor);
                        cnn::as_vector((vector<float,_std::allocator<float>_> *)local_428,pTVar11);
                        pvVar19 = local_3a8;
                        local_39c = 0xffffffff;
                        if ((long)pEStack_420 - (long)local_428 == 0) {
                          iVar18 = -1;
                        }
                        else {
                          auVar25 = ZEXT1664(ZEXT816(0xd4b075823b6c498a));
                          lVar21 = (long)pEStack_420 - (long)local_428 >> 2;
                          uVar13 = 0xffffffff;
                          uVar20 = 0;
                          do {
                            dVar23 = (double)*(float *)((long)&(((
                                                  vector<cnn::Node_*,_std::allocator<cnn::Node_*>_>
                                                  *)local_428)->
                                                  super__Vector_base<cnn::Node_*,_std::allocator<cnn::Node_*>_>
                                                  )._M_impl.super__Vector_impl_data._M_start +
                                                  uVar20 * 4);
                            if (auVar25._0_8_ < dVar23) {
                              local_39c = (uint)uVar20;
                              uVar13 = uVar20 & 0xffffffff;
                              auVar25 = ZEXT1664(CONCAT88(in_XMM2_Qb,dVar23));
                            }
                            iVar18 = (int)uVar13;
                            uVar20 = uVar20 + 1;
                          } while (lVar21 + (ulong)(lVar21 == 0) != uVar20);
                        }
                        this_00 = (vector<int,std::allocator<int>> *)
                                  ((local_228->nodes).
                                   super__Vector_base<cnn::Node_*,_std::allocator<cnn::Node_*>_>.
                                   _M_impl.super__Vector_impl_data._M_start + (long)local_3a8 * 3);
                        __position._M_current = *(int **)(this_00 + 8);
                        if (__position._M_current == *(int **)(this_00 + 0x10)) {
                          std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                                    (this_00,__position,(int *)&local_39c);
                        }
                        else {
                          *__position._M_current = iVar18;
                          *(int **)(this_00 + 8) = __position._M_current + 1;
                        }
                        pvVar2 = (local_348->
                                 super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                 )._M_impl.super__Vector_impl_data._M_start;
                        lVar21 = *(long *)&pvVar2[(long)pvVar19].
                                           super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                           super__Vector_impl_data;
                        lVar15 = (long)pvVar2[(long)pvVar19].
                                       super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                       super__Vector_impl_data._M_finish - lVar21;
                        if ((ulong)(long)(int)local_3b0 < (ulong)(lVar15 >> 2)) {
                          uVar17 = *(uint *)(lVar21 + (long)(int)local_3b0 * 4);
                          if (uVar17 == local_39c) {
                            auVar25 = ZEXT864((ulong)(*(double *)predict + 1.0));
                            *(double *)predict = *(double *)predict + 1.0;
                          }
                          cnn::expr::pickneglogsoftmax((expr *)&local_2f8,&local_2e8,uVar17);
                          std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>
                          ::emplace_back<cnn::expr::Expression>
                                    ((vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>
                                      *)local_218,(Expression *)&local_2f8);
                        }
                        else {
                          cnn::expr::pickneglogsoftmax
                                    ((expr *)&local_2f8,&local_2e8,*(uint *)(lVar21 + -4 + lVar15));
                          std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>
                          ::emplace_back<cnn::expr::Expression>
                                    ((vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>
                                      *)local_218,(Expression *)&local_2f8);
                        }
                        bVar22 = local_39c != endlabel;
                        if (local_428 != (undefined1  [8])0x0) {
                          operator_delete((void *)local_428);
                        }
                        local_3b0 = (vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                     *)CONCAT44(local_3b0._4_4_,(int)local_3b0 + 1);
                      }
                      if ((ComputationGraph *)local_3c8._0_8_ != (ComputationGraph *)0x0) {
                        operator_delete((void *)local_3c8._0_8_);
                      }
                    } while (bVar22);
                    if (overall != (uint *)0x0) {
                      *overall = *overall + (int)local_3b0;
                    }
                    piVar5 = (int *)CONCAT71(in_stack_00000021,train);
                    pvVar19 = (vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                               *)local_428;
                    if (piVar5 != (int *)0x0) {
                      pvVar2 = (local_348->
                               super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                               )._M_impl.super__Vector_impl_data._M_start;
                      pvVar19 = (vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                 *)((ulong)((long)pvVar2[(long)local_3a8].
                                                  super__Vector_base<int,_std::allocator<int>_>.
                                                  _M_impl.super__Vector_impl_data._M_finish -
                                           *(long *)&pvVar2[(long)local_3a8].
                                                     super__Vector_base<int,_std::allocator<int>_>.
                                                     _M_impl.super__Vector_impl_data) >> 2);
                      *piVar5 = *piVar5 + (int)pvVar19;
                    }
                  }
                  else {
                    uStack_40c = 1;
                    local_408 = 1;
                    local_428._0_4_ = HIDDEN_DIM;
                    cnn::expr::zeroes((expr *)local_3d8,(ComputationGraph *)cor,(Dim *)local_428);
                    pvVar2 = (local_348->
                             super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                             )._M_impl.super__Vector_impl_data._M_start;
                    local_338 = (vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                 *)((long)local_3a8 * 3);
                    if (pvVar2[(long)local_3a8].super__Vector_base<int,_std::allocator<int>_>.
                        _M_impl.super__Vector_impl_data._M_finish ==
                        pvVar2[(long)local_3a8].super__Vector_base<int,_std::allocator<int>_>.
                        _M_impl.super__Vector_impl_data._M_start) {
                      pEVar12 = (ExecutionEngine *)0x0;
                      local_3b0 = (vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                   *)((ulong)local_3b0._4_4_ << 0x20);
                      pvVar19 = local_3a8;
                    }
                    else {
                      local_350 = (ExecutionEngine *)((long)local_3a8 << 4);
                      local_340 = (ExecutionEngine *)0x0;
                      local_3b0 = (vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                   *)((ulong)local_3b0._4_4_ << 0x20);
                      do {
                        std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>::
                        vector((vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>
                                *)local_3c8,local_220,(allocator_type *)local_428);
                        lVar21 = 0;
                        do {
                          dVar23 = auVar25._0_8_;
                          cnn::expr::operator*
                                    ((expr *)&local_50,(Expression *)local_c0,
                                     (Expression *)
                                     ((long)&(local_250.
                                              super__Vector_base<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>
                                              ._M_impl.super__Vector_impl_data._M_start)->pg +
                                     lVar21));
                          cnn::expr::operator*
                                    ((expr *)&local_200,(Expression *)local_d0,
                                     (Expression *)local_3d8);
                          cnn::expr::operator+((expr *)&local_40,&local_50,(Expression *)&local_200)
                          ;
                          auVar25._0_8_ = cnn::expr::tanh((expr *)&local_2a0,dVar23);
                          auVar25._8_56_ = extraout_var_00;
                          cnn::expr::operator*
                                    ((expr *)local_428,(Expression *)local_e0,
                                     (Expression *)&local_2a0);
                          dVar23 = auVar25._0_8_;
                          *(undefined1 (*) [8])
                           ((long)&(((vector<cnn::Node_*,_std::allocator<cnn::Node_*>_> *)
                                    local_3c8._0_8_)->
                                   super__Vector_base<cnn::Node_*,_std::allocator<cnn::Node_*>_>).
                                   _M_impl.super__Vector_impl_data._M_start + lVar21) = local_428;
                          *(uint *)((long)&(((vector<cnn::Node_*,_std::allocator<cnn::Node_*>_> *)
                                            local_3c8._0_8_)->
                                           super__Vector_base<cnn::Node_*,_std::allocator<cnn::Node_*>_>
                                           )._M_impl.super__Vector_impl_data._M_finish + lVar21) =
                               pEStack_420._0_4_;
                          lVar21 = lVar21 + 0x10;
                        } while (lVar14 != lVar21);
                        cnn::expr::detail::
                        f<cnn::ConcatenateColumns,std::vector<cnn::expr::Expression,std::allocator<cnn::expr::Expression>>>
                                  ((detail *)&local_2a0,&local_250);
                        cnn::expr::detail::
                        f<cnn::Concatenate,std::vector<cnn::expr::Expression,std::allocator<cnn::expr::Expression>>>
                                  ((detail *)local_428,
                                   (vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>
                                    *)local_3c8);
                        cnn::expr::softmax((expr *)&local_40,(Expression *)local_428);
                        cnn::expr::transpose((expr *)&local_200,&local_40);
                        cnn::expr::transpose((expr *)&local_2e8,(Expression *)&local_2a0);
                        cnn::expr::operator*((expr *)&local_50,(Expression *)&local_200,&local_2e8);
                        cnn::expr::transpose((expr *)local_428,&local_50);
                        local_418 = (ComputationGraph *)local_428;
                        local_410 = pEStack_420._0_4_;
                        local_200._M_len = 2;
                        pEStack_420._0_4_ =
                             *(undefined4 *)
                              ((long)&((local_250.
                                        super__Vector_base<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>
                                        ._M_impl.super__Vector_impl_data._M_start)->i).t +
                              (long)local_350);
                        local_428 = (undefined1  [8])
                                    *(undefined8 *)
                                     ((long)&(local_250.
                                              super__Vector_base<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>
                                              ._M_impl.super__Vector_impl_data._M_start)->pg +
                                     (long)local_350);
                        local_200._M_array = (iterator)local_428;
                        cnn::expr::detail::
                        f<cnn::Concatenate,std::initializer_list<cnn::expr::Expression>>
                                  ((detail *)&local_50,&local_200);
                        cnn::RNNBuilder::add_input((RNNBuilder *)local_428,(Expression *)local_398);
                        EVar27 = _local_428;
                        local_400 = pEStack_420._0_4_;
                        local_2f8._M_len = 3;
                        local_3d8 = local_428;
                        pEStack_420._0_4_ = local_1f0._8_4_;
                        local_428 = (undefined1  [8])local_1f0._0_8_;
                        local_418 = (ComputationGraph *)local_1f0._16_8_;
                        local_410 = local_1d8;
                        local_408 = (uint)EVar27.pg;
                        uStack_404 = EVar27.pg._4_4_;
                        local_3d0 = CONCAT44(local_3d0._4_4_,local_400);
                        local_2f8._M_array = (iterator)local_428;
                        cnn::expr::detail::
                        f<cnn::AffineTransform,std::initializer_list<cnn::expr::Expression>>
                                  ((detail *)&local_2e8,&local_2f8);
                        auVar25._0_8_ = cnn::expr::tanh((expr *)&local_200,dVar23);
                        auVar25._8_56_ = extraout_var_01;
                        cnn::expr::operator*
                                  ((expr *)&local_2e8,(Expression *)local_f0,
                                   (Expression *)&local_200);
                        if (predict != (uint *)0x0) {
                          pTVar11 = cnn::ComputationGraph::incremental_forward
                                              ((ComputationGraph *)cor);
                          cnn::as_vector((vector<float,_std::allocator<float>_> *)local_428,pTVar11)
                          ;
                          if ((long)pEStack_420 - (long)local_428 == 0) {
                            uVar17 = 0xffffffff;
                          }
                          else {
                            auVar25 = ZEXT1664(ZEXT816(0xd4b075823b6c498a));
                            lVar21 = (long)pEStack_420 - (long)local_428 >> 2;
                            uVar20 = 0xffffffff;
                            uVar13 = 0;
                            do {
                              auVar26._0_8_ =
                                   (double)*(float *)((long)&(((
                                                  vector<cnn::Node_*,_std::allocator<cnn::Node_*>_>
                                                  *)local_428)->
                                                  super__Vector_base<cnn::Node_*,_std::allocator<cnn::Node_*>_>
                                                  )._M_impl.super__Vector_impl_data._M_start +
                                                  uVar13 * 4);
                              auVar26._8_8_ = in_XMM2_Qb;
                              dVar23 = auVar25._0_8_;
                              auVar4 = vmaxsd_avx(auVar26,auVar25._0_16_);
                              auVar25 = ZEXT1664(auVar4);
                              if (dVar23 < auVar26._0_8_) {
                                uVar20 = uVar13 & 0xffffffff;
                              }
                              uVar17 = (uint)uVar20;
                              uVar13 = uVar13 + 1;
                            } while (lVar21 + (ulong)(lVar21 == 0) != uVar13);
                          }
                          v = (&(((local_348->
                                  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                  )._M_impl.super__Vector_impl_data._M_start)->
                                super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                                super__Vector_impl_data._M_start)[(long)local_338][(long)local_340];
                          if (v == uVar17) {
                            auVar25 = ZEXT864((ulong)(*(double *)predict + 1.0));
                            *(double *)predict = *(double *)predict + 1.0;
                          }
                          cnn::expr::pickneglogsoftmax((expr *)&local_2f8,&local_2e8,v);
                          std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>
                          ::emplace_back<cnn::expr::Expression>
                                    ((vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>
                                      *)local_218,(Expression *)&local_2f8);
                          if (local_428 != (undefined1  [8])0x0) {
                            operator_delete((void *)local_428);
                          }
                          local_3b0 = (vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                       *)CONCAT44(local_3b0._4_4_,(int)local_3b0 + 1);
                        }
                        if ((ComputationGraph *)local_3c8._0_8_ != (ComputationGraph *)0x0) {
                          operator_delete((void *)local_3c8._0_8_);
                        }
                        local_340 = (ExecutionEngine *)(long)(int)local_3b0;
                        pvVar2 = (local_348->
                                 super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                 )._M_impl.super__Vector_impl_data._M_start;
                        pEVar12 = (ExecutionEngine *)
                                  ((long)(&(pvVar2->super__Vector_base<int,_std::allocator<int>_>).
                                           _M_impl.super__Vector_impl_data._M_finish)
                                         [(long)local_338] -
                                   (long)(&(pvVar2->super__Vector_base<int,_std::allocator<int>_>).
                                           _M_impl.super__Vector_impl_data._M_start)
                                         [(long)local_338] >> 2);
                        pvVar19 = local_338;
                      } while (local_340 < pEVar12);
                    }
                    if (overall != (uint *)0x0) {
                      pvVar19 = (vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                 *)((ulong)local_3b0 & 0xffffffff);
                      *overall = *overall + (int)local_3b0;
                    }
                    piVar5 = (int *)CONCAT71(in_stack_00000021,train);
                    if (piVar5 != (int *)0x0) {
                      *piVar5 = *piVar5 + (int)pEVar12;
                    }
                  }
                  local_3a8 = (vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                               *)((long)&(local_3a8->
                                         super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                         )._M_impl.super__Vector_impl_data._M_start + 1);
                } while (local_3a8 != local_2a8);
              }
            }
          }
        }
      }
    }
  }
  pRVar9 = local_1a0;
  cnn::expr::detail::
  f<cnn::Sum,std::vector<cnn::expr::Expression,std::allocator<cnn::expr::Expression>>>
            ((detail *)local_1a0,
             (vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_> *)local_218);
  if ((pointer)local_218._0_8_ != (pointer)0x0) {
    operator_delete((void *)local_218._0_8_);
  }
  if (local_250.super__Vector_base<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_250.
                    super__Vector_base<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>
                    ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_168.super__Vector_base<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_168.
                    super__Vector_base<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>
                    ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_150.super__Vector_base<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_150.
                    super__Vector_base<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>
                    ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_310.super__Vector_base<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_310.
                    super__Vector_base<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>
                    ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_2d8.super__Vector_base<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_2d8.
                    super__Vector_base<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>
                    ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_138.super__Vector_base<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_138.
                    super__Vector_base<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>
                    ._M_impl.super__Vector_impl_data._M_start);
  }
  std::
  vector<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>,_std::allocator<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>_>_>
  ::~vector(&local_198);
  if (local_120.super__Vector_base<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_120.
                    super__Vector_base<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>
                    ._M_impl.super__Vector_impl_data._M_start);
  }
  std::
  vector<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>,_std::allocator<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>_>_>
  ::~vector(&local_1d0);
  std::
  vector<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>,_std::allocator<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>_>_>
  ::~vector(&local_108);
  std::
  vector<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>,_std::allocator<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>_>_>
  ::~vector(&local_180);
  std::
  vector<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>,_std::allocator<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>_>_>
  ::~vector(&local_2c0);
  std::
  vector<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>,_std::allocator<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>_>_>
  ::~vector(&local_328);
  uVar16 = extraout_RDX;
  if (local_1b8.super__Vector_base<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_1b8.
                    super__Vector_base<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>
                    ._M_impl.super__Vector_impl_data._M_start);
    uVar16 = extraout_RDX_00;
  }
  EVar27._8_8_ = uVar16;
  EVar27.pg = (ComputationGraph *)pRVar9;
  return EVar27;
}

Assistant:

Expression BuildTaggingGraph(const vector<int>& sent, const vector< vector<int> >& chars, const vector< vector<int> >& labels,  vector< vector<int> >& results, ComputationGraph& cg, double* cor = 0, unsigned* predict = 0, unsigned* overall = 0, bool train=true) {
    const unsigned slen = sent.size();
    l2rbuilder.new_graph(cg);  // reset RNN builder for new graph
    l2rbuilder.start_new_sequence();
    r2lbuilder.new_graph(cg);  // reset RNN builder for new graph
    r2lbuilder.start_new_sequence();
    results.resize(slen);

    Expression i_wordpadding_2 = parameter(cg, p_wordpadding_2);
    Expression i_wordpadding_1 = parameter(cg, p_wordpadding_1);
    Expression i_wordpadding2 = parameter(cg, p_wordpadding2);
    Expression i_wordpadding1 = parameter(cg, p_wordpadding1);

    Expression i_charpadding_2 = parameter(cg, p_charpadding_2);
    Expression i_charpadding_1 = parameter(cg, p_charpadding_1);
    Expression i_charpadding2 = parameter(cg, p_charpadding2);
    Expression i_charpadding1 = parameter(cg, p_charpadding1);
  
    Expression i_charw2charh = parameter(cg, p_charw2charh);
    Expression i_charhbias = parameter(cg, p_charhbias);
    //attention pooling
    Expression i_charh2xMExp = parameter(cg, p_charh2xMExp);
    Expression i_word2xMExp = parameter(cg, p_word2xMExp);
    Expression i_xMExpbias = parameter(cg, p_xMExpbias);
    Expression i_xMExp2xExp = parameter(cg, p_xMExp2xExp);
    //
    
    // Expression i_l2oh = parameter(cg, p_l2oh);
    // Expression i_r2oh = parameter(cg, p_r2oh);
    // Expression i_ohbias = parameter(cg, p_ohbias);

    //attention labeling
    Expression i_oh2ohxMExp = parameter(cg, p_oh2ohxMExp);
    Expression oh2ohxMExp = parameter(cg, p_osh2ohxMExp);
    Expression i_u = parameter(cg, p_u);

    Expression i_oh2lh = parameter(cg, p_oh2lh);
    Expression i_lhbias = parameter(cg, p_lhbias);

    Expression i_lh2l = parameter(cg, p_lh2l);

    vector<Expression> i_word(slen);

    vector< vector<Expression> > i_char(slen);
    vector< vector<Expression> > i_charw(slen);
    vector< vector<Expression> > i_charh(slen);
    //attention pooling
    vector< vector<Expression> > i_charxMExp(slen);
    vector< vector<Expression> > i_charxExp(slen);
    vector< Expression > i_charSum(slen);
    vector< vector<Expression> > i_charPool(slen);
    vector< Expression > i_charinput(slen);
    //

    vector< Expression > i_input(slen);
    vector< Expression > i_inputw(slen);

    vector<Expression> fwds(slen);
    vector<Expression> revs(slen);
    vector<Expression> i_oh(slen);

    vector<Expression> errs; 
    for (unsigned i = 0; i < slen; ++i) {
      i_word[i] = lookup(cg, p_w, sent[i]);
      if (!eval) { i_word[i] = dropout(i_word[i], pdrop); }
      i_char[i].resize(chars[i].size());
      for (unsigned j = 0; j < chars[i].size(); ++j) {
        i_char[i][j] = lookup(cg, p_c, chars[i][j]);
        if (!eval) { i_char[i][j] = dropout(i_char[i][j], pdrop); }
      }
//      cerr<<"lookup done"<<endl;
      i_charw[i].resize(i_char[i].size());
      i_charh[i].resize(i_char[i].size());
      i_charxMExp[i].resize(i_char[i].size());
      i_charxExp[i].resize(i_char[i].size());
      for (int j = 0; j < i_char[i].size(); ++j) {
        if ( j-1 < 0){
	  if ( j+1 >= i_char[i].size())
	    i_charw[i][j] = concatenate({i_charpadding_2, i_charpadding_1, i_char[i][j], i_charpadding1, i_charpadding2});
	  else if ( j+2 >= i_char[i].size())
	    i_charw[i][j] = concatenate({i_charpadding_2, i_charpadding_1, i_char[i][j], i_char[i][j+1], i_charpadding1});
	  else
	    i_charw[i][j] = concatenate({i_charpadding_2, i_charpadding_1, i_char[i][j], i_char[i][j+1], i_char[i][j+2]});
  	}
	else if ( j-2 < 0){
	  if ( j+1 >= i_char[i].size())
	    i_charw[i][j] = concatenate({i_charpadding_1, i_char[i][j-1], i_char[i][j], i_charpadding1, i_charpadding2});
    	  else if ( j+2 >= i_char[i].size())
	    i_charw[i][j] = concatenate({i_charpadding_1, i_char[i][j-1], i_char[i][j], i_char[i][j+1], i_charpadding1});
	  else
	    i_charw[i][j] = concatenate({i_charpadding_1, i_char[i][j-1], i_char[i][j], i_char[i][j+1], i_char[i][j+2]});
        }
  	else{
	  if ( j+1 >= i_char[i].size())
            i_charw[i][j] = concatenate({i_char[i][j-2], i_char[i][j-1], i_char[i][j], i_charpadding1, i_charpadding2});
          else if ( j+2 >= i_char[i].size())
            i_charw[i][j] = concatenate({i_char[i][j-2], i_char[i][j-1], i_char[i][j], i_char[i][j+1], i_charpadding1});
          else 
            i_charw[i][j] = concatenate({i_char[i][j-2], i_char[i][j-1], i_char[i][j], i_char[i][j+1], i_char[i][j+2]});
	}
	i_charh[i][j] = tanh(affine_transform({i_charhbias, i_charw2charh ,i_charw[i][j]}));
	i_charxMExp[i][j] = tanh(affine_transform({i_xMExpbias, i_charh2xMExp, i_charh[i][j], i_word2xMExp, i_word[i]}));
	i_charxExp[i][j] = exp(i_xMExp2xExp * i_charxMExp[i][j]);
      }
      i_charSum[i] = sum(i_charxExp[i]);
      i_charPool[i].resize(i_char[i].size());
      for (unsigned j = 0; j < i_char[i].size(); ++j){
        i_charPool[i][j] = cwise_multiply(i_charh[i][j], cdiv(i_charxExp[i][j], i_charSum[i]));
      }
      i_charinput[i] = sum(i_charPool[i]);
    }
//    cerr<<"input done"<<endl;
    for (unsigned i = 0; i < slen; ++i) {
      i_input[i] = concatenate({i_charinput[i], i_word[i]});
    }
//    cerr<<"concatenate done"<<endl;
    for (int i = 0; i < slen; ++i) {
      if(i-1 < 0){
        if(i+1>= slen){
	  i_inputw[i] = concatenate({i_wordpadding_2, i_wordpadding_1, i_input[i], i_wordpadding1, i_wordpadding2});
	}
   	else if(i+2>=slen){
	  i_inputw[i] = concatenate({i_wordpadding_2, i_wordpadding_1, i_input[i], i_input[i+1], i_wordpadding1});
	}
 	else{
 	  i_inputw[i] = concatenate({i_wordpadding_2, i_wordpadding_1, i_input[i], i_input[i+1], i_input[i+2]});
	}
      }
      else if(i-2<0){
        if(i+1>= slen){
          i_inputw[i] = concatenate({i_wordpadding_1, i_input[i-1], i_input[i], i_wordpadding1, i_wordpadding2});
        }
        else if(i+2>=slen){
          i_inputw[i] = concatenate({i_wordpadding_1, i_input[i-1], i_input[i], i_input[i+1], i_wordpadding1});
        }
        else{
          i_inputw[i] = concatenate({i_wordpadding_1, i_input[i-1], i_input[i], i_input[i+1], i_input[i+2]});
        }
      }
      else{
        if(i+1>= slen){
          i_inputw[i] = concatenate({i_input[i-2], i_input[i-1], i_input[i], i_wordpadding1, i_wordpadding2});
        }
        else if(i+2>=slen){
          i_inputw[i] = concatenate({i_input[i-2], i_input[i-1], i_input[i], i_input[i+1], i_wordpadding1});
        }
        else{
          i_inputw[i] = concatenate({i_input[i-2], i_input[i-1], i_input[i], i_input[i+1], i_input[i+2]});
        }
      }
    }
//    cerr<<"intput windows done "<<INPUT_WINDOWS_DIM<<endl;
    for (unsigned i = 0; i < slen; ++i)
      fwds[i] = l2rbuilder.add_input(i_inputw[i]);
    for (unsigned i = 0; i < slen; ++i)
      revs[slen - i - 1] = r2lbuilder.add_input(i_inputw[slen - i - 1]);   
//    cerr<<"lstm done"<<endl;
    for (unsigned i = 0; i < slen; ++i)
      //i_oh[i] = tanh(affine_transform({i_ohbias, i_l2oh, fwds[i], i_r2oh, revs[i]}));
        i_oh[i] = concatenate({fwds[i], revs[i]});

    for (unsigned i = 0; i < slen; ++i) {
   //   cerr<<i<<endl;
      orderbuilder.new_graph(cg);
      orderbuilder.start_new_sequence();
      if(train) {
	int j = 0;

	Expression oh = zeroes(cg, {HIDDEN_DIM});

	while(j < labels[i].size()){
	  //attention
	  Expression i_att_oh;
      	  vector<Expression> alpha_i(slen);
	  for (unsigned att = 0; att < slen; ++att){
	    alpha_i[att] = i_u * tanh(i_oh2ohxMExp * i_oh[att] + oh2ohxMExp * oh);
   	  }

  	  Expression input_cols = concatenate_cols(i_oh);
	  Expression alpha = softmax(concatenate(alpha_i));
    	  i_att_oh = transpose( transpose(alpha) * transpose( input_cols ) );
	  
	  Expression combine_h = concatenate({i_oh[i], i_att_oh});
	  oh = orderbuilder.add_input(combine_h);

          Expression i_lh = tanh(affine_transform({i_lhbias, i_oh2lh, oh}));
          Expression i_l = i_lh2l * i_lh;
	  
	  if (cor) {
	    vector<float> dist = as_vector(cg.incremental_forward());
	    double best = -9e99;
	    int bestk = -1;
            for (int k = 0; k < dist.size(); ++k) {
              if(dist[k] > best) {best = dist[k]; bestk = k; }
            }
            if (labels[i][j] == bestk) (*cor)++;
	    errs.push_back(pickneglogsoftmax(i_l, labels[i][j]));
            j += 1;
	  } 
	}
        if(predict) (*predict) += j;
        if(overall) (*overall) += labels[i].size();
      }
      else{
	int j = 0;
	
	Expression oh = zeroes(cg, {HIDDEN_DIM});

        while(j < 7) {
	  //attention
	  Expression i_att_oh;
          vector<Expression> alpha_i(slen);
          for (unsigned att = 0; att < slen; ++att){
            alpha_i[att] = i_u * tanh(i_oh2ohxMExp * i_oh[att] + oh2ohxMExp * oh);
          }

          Expression input_cols = concatenate_cols(i_oh);
          Expression alpha = softmax(concatenate(alpha_i));
          i_att_oh = transpose( transpose(alpha) * transpose( input_cols ) );

          Expression combine_h = concatenate({i_oh[i], i_att_oh});
          oh = orderbuilder.add_input(combine_h);

          Expression i_lh = tanh(affine_transform({i_lhbias, i_oh2lh, oh}));
          Expression i_l = i_lh2l * i_lh;
	  if (cor) {
	    vector<float> dist = as_vector(cg.incremental_forward());
	    double best = -9e99;
	    int bestk = -1;
	    for (int k = 0; k < dist.size(); ++k) {
	      if(dist[k] > best) {best = dist[k]; bestk = k; }
   	    }
		results[i].push_back(bestk);
	    if (j < labels[i].size() && labels[i][j] == bestk) (*cor)++;
	  
	    if (j < labels[i].size()) errs.push_back(pickneglogsoftmax(i_l, labels[i][j]));
	    else errs.push_back(pickneglogsoftmax(i_l, labels[i][labels[i].size()-1]));
	    j += 1;
	    if(bestk == endlabel) break;
	  }
       }
       if(predict) (*predict) += j;
       if(overall) (*overall) += labels[i].size();
     }
    }
//    cerr<<"errs done"<<endl;
    return sum(errs);
  }